

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pcMats)

{
  aiMaterial *this_00;
  size_t sVar1;
  undefined1 local_448 [8];
  aiString szFile;
  aiMaterial *local_38;
  aiMaterial *pcMatOut;
  Skin_MDL7 *pcSkin;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pcMats_local;
  uchar **szCurrentOut_local;
  uchar *szCurrent_local;
  MDLImporter *this_local;
  
  pcSkin = (Skin_MDL7 *)pcMats;
  pcMats_local = (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)szCurrentOut;
  szCurrentOut_local = (uchar **)szCurrent;
  szCurrent_local = (uchar *)this;
  if (szCurrent == (uchar *)0x0) {
    __assert_fail("__null != szCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x328,
                  "void Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7(const unsigned char *, const unsigned char **, std::vector<aiMaterial *> &)"
                 );
  }
  if (szCurrentOut != (uchar **)0x0) {
    *szCurrentOut = szCurrent;
    szCurrentOut_local = (uchar **)(szCurrent + 0xc);
    pcMatOut = (aiMaterial *)szCurrent;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    local_38 = this_00;
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
              ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pcSkin,&local_38);
    szCurrentOut_local = szCurrentOut_local + 2;
    ParseSkinLump_3DGS_MDL7
              (this,(uchar *)szCurrentOut_local,(uchar **)pcMats_local,local_38,
               (uint)*(byte *)&pcMatOut->mProperties,*(uint *)((long)&pcMatOut->mProperties + 4),
               pcMatOut->mNumProperties);
    if ((char)pcMatOut->mNumAllocated != '\0') {
      aiString::aiString((aiString *)local_448);
      unique0x00012000 = *(undefined8 *)&pcMatOut->mNumAllocated;
      szFile.data._0_8_ = *(undefined8 *)((long)&pcMatOut[1].mProperties + 4);
      szFile.data[8] = '\0';
      sVar1 = strlen(local_448 + 4);
      local_448._0_4_ = (undefined4)sVar1;
      aiMaterial::AddProperty(local_38,(aiString *)local_448,"?mat.name",0,0);
    }
    return;
  }
  __assert_fail("__null != szCurrentOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,0x329,
                "void Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7(const unsigned char *, const unsigned char **, std::vector<aiMaterial *> &)"
               );
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    std::vector<aiMaterial*>& pcMats)
{
    ai_assert(NULL != szCurrent);
    ai_assert(NULL != szCurrentOut);

    *szCurrentOut = szCurrent;
    BE_NCONST MDL::Skin_MDL7* pcSkin = (BE_NCONST MDL::Skin_MDL7*)szCurrent;
    AI_SWAP4(pcSkin->width);
    AI_SWAP4(pcSkin->height);
    szCurrent += 12;

    // allocate an output material
    aiMaterial* pcMatOut = new aiMaterial();
    pcMats.push_back(pcMatOut);

    // skip length of file name
    szCurrent += AI_MDL7_MAX_TEXNAMESIZE;

    ParseSkinLump_3DGS_MDL7(szCurrent,szCurrentOut,pcMatOut,
        pcSkin->typ,pcSkin->width,pcSkin->height);

    // place the name of the skin in the material
    if (pcSkin->texture_name[0])
    {
        // the 0 termination could be there or not - we can't know
        aiString szFile;
        ::memcpy(szFile.data,pcSkin->texture_name,sizeof(pcSkin->texture_name));
        szFile.data[sizeof(pcSkin->texture_name)] = '\0';
        szFile.length = ::strlen(szFile.data);

        pcMatOut->AddProperty(&szFile,AI_MATKEY_NAME);
    }
}